

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTransport.h
# Opt level: O2

void __thiscall
duckdb_apache::thrift::transport::TTransport::consume_virt(TTransport *this,uint32_t param_1)

{
  TTransportException *this_00;
  undefined4 in_register_00000034;
  allocator local_39;
  string local_38;
  
  this_00 = (TTransportException *)
            __cxa_allocate_exception(0x30,CONCAT44(in_register_00000034,param_1));
  std::__cxx11::string::string((string *)&local_38,"Base TTransport cannot consume.",&local_39);
  TTransportException::TTransportException(this_00,NOT_OPEN,&local_38);
  __cxa_throw(this_00,&TTransportException::typeinfo,TException::~TException);
}

Assistant:

virtual void consume_virt(uint32_t /* len */) {
    throw TTransportException(TTransportException::NOT_OPEN, "Base TTransport cannot consume.");
  }